

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
reserve(vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
        *this,size_t n)

{
  memory_resource *pmVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  int i;
  ulong uVar4;
  
  if (this->nAlloc < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar2 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 0x50,8);
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < this->nStored; uVar4 = uVar4 + 1) {
      pbrt::PiecewiseConstant1D::PiecewiseConstant1D
                ((PiecewiseConstant1D *)
                 ((long)&(((PiecewiseConstant1D *)CONCAT44(extraout_var,iVar2))->func).alloc.
                         memoryResource + lVar3),
                 (PiecewiseConstant1D *)((long)&(this->ptr->func).alloc.memoryResource + lVar3));
      pbrt::PiecewiseConstant1D::~PiecewiseConstant1D
                ((PiecewiseConstant1D *)((long)&(this->ptr->func).alloc.memoryResource + lVar3));
      lVar3 = lVar3 + 0x50;
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc * 0x50,8);
    this->nAlloc = n;
    this->ptr = (PiecewiseConstant1D *)CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }